

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

int Ses_StoreGetEntry(Ses_Store_t *pStore,word *pTruth,int nVars,int *pArrTimeProfile,char **pSol)

{
  int iVar1;
  int local_78 [2];
  int pTimes [8];
  int *local_50;
  Ses_TimesEntry_t *pTiEntry;
  Ses_TruthEntry_t *pTEntry;
  int key;
  char **pSol_local;
  int *pArrTimeProfile_local;
  int nVars_local;
  word *pTruth_local;
  Ses_Store_t *pStore_local;
  
  iVar1 = Ses_StoreTableHash(pTruth,nVars);
  pTiEntry = (Ses_TimesEntry_t *)pStore->pEntries[iVar1];
  while ((pTiEntry != (Ses_TimesEntry_t *)0x0 &&
         (iVar1 = Ses_StoreTruthEqual((Ses_TruthEntry_t *)pTiEntry,pTruth,nVars), iVar1 == 0))) {
    pTiEntry = pTiEntry->next;
  }
  if (pTiEntry == (Ses_TimesEntry_t *)0x0) {
    pStore_local._4_4_ = 0;
  }
  else {
    local_50 = (int *)pTiEntry->pNetwork;
    do {
      while( true ) {
        if (local_50 == (int *)0x0) goto LAB_00303241;
        if (*(long *)(local_50 + 0xc) != 0) break;
        iVar1 = Ses_StoreTimesEqual(pArrTimeProfile,local_50,nVars);
        if (iVar1 != 0) goto LAB_00303241;
        local_50 = *(int **)(local_50 + 10);
      }
      memcpy(local_78,pArrTimeProfile,(long)nVars << 2);
      Abc_ExactNormalizeArrivalTimesForNetwork(nVars,local_78,*(char **)(local_50 + 0xc));
      iVar1 = Ses_StoreTimesEqual(local_78,local_50,nVars);
    } while (iVar1 == 0);
LAB_00303241:
    if (local_50 == (int *)0x0) {
      pStore_local._4_4_ = 0;
    }
    else {
      *pSol = *(char **)(local_50 + 0xc);
      pStore_local._4_4_ = 1;
    }
  }
  return pStore_local._4_4_;
}

Assistant:

int Ses_StoreGetEntry( Ses_Store_t * pStore, word * pTruth, int nVars, int * pArrTimeProfile, char ** pSol )
{
    int key;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;
    int pTimes[8];

    key = Ses_StoreTableHash( pTruth, nVars );
    pTEntry = pStore->pEntries[key];

    /* find truth table entry */
    while ( pTEntry )
    {
        if ( Ses_StoreTruthEqual( pTEntry, pTruth, nVars ) )
            break;
        else
            pTEntry = pTEntry->next;
    }

    /* no entry found? */
    if ( !pTEntry )
        return 0;

    /* find times entry */
    pTiEntry = pTEntry->head;
    while ( pTiEntry )
    {
        /* found after normalization wrt. to network */
        if ( pTiEntry->pNetwork )
        {
            memcpy( pTimes, pArrTimeProfile, sizeof(int) * nVars );
            Abc_ExactNormalizeArrivalTimesForNetwork( nVars, pTimes, pTiEntry->pNetwork );

            if ( Ses_StoreTimesEqual( pTimes, pTiEntry->pArrTimeProfile, nVars ) )
                break;
        }
        /* found for non synthesized network */
        else if ( Ses_StoreTimesEqual( pArrTimeProfile, pTiEntry->pArrTimeProfile, nVars ) )
            break;
        else
            pTiEntry = pTiEntry->next;
    }

    /* no entry found? */
    if ( !pTiEntry )
        return 0;

    *pSol = pTiEntry->pNetwork;
    return 1;
}